

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::GeneratedExtensionFinder::Find
          (GeneratedExtensionFinder *this,int number,ExtensionInfo *output)

{
  ExtensionInfo *__src;
  ExtensionInfo *extension;
  ExtensionInfo *output_local;
  int number_local;
  GeneratedExtensionFinder *this_local;
  
  __src = anon_unknown_22::FindRegisteredExtension(this->extendee_,number);
  if (__src != (ExtensionInfo *)0x0) {
    memcpy(output,__src,0x28);
  }
  return __src != (ExtensionInfo *)0x0;
}

Assistant:

bool GeneratedExtensionFinder::Find(int number, ExtensionInfo* output) {
  const ExtensionInfo* extension = FindRegisteredExtension(extendee_, number);
  if (extension == nullptr) {
    return false;
  } else {
    *output = *extension;
    return true;
  }
}